

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureWrapCase::init(TextureWrapCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  Texture2D *pTVar4;
  undefined1 *local_30;
  float afStack_28 [2];
  Vec4 local_20;
  
  pbVar1 = (this->m_filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar2) {
    pTVar4 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (pTVar4,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height
              );
    this->m_texture = pTVar4;
    tcu::Texture2D::allocLevel(&pTVar4->m_refTexture,0);
    local_20.m_data[0] = -0.5;
    local_20.m_data[1] = -0.5;
    local_20.m_data[2] = -0.5;
    local_20.m_data[3] = 2.0;
    local_30 = &DAT_3f8000003f800000;
    afStack_28[0] = 1.0;
    afStack_28[1] = 0.0;
    tcu::fillWithComponentGradients
              ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start,&local_20,(Vec4 *)&local_30);
    iVar3 = (*this->m_texture->_vptr_Texture2D[2])();
  }
  else {
    pTVar4 = glu::Texture2D::create
                       (this->m_renderCtx,this->m_renderCtxInfo,
                        ((this->super_TestCase).super_TestNode.m_testCtx)->m_curArchive,
                        (int)((ulong)((long)pbVar2 - (long)pbVar1) >> 5),&this->m_filenames);
    this->m_texture = pTVar4;
    this->m_width = (pTVar4->m_refTexture).m_width;
    iVar3 = (pTVar4->m_refTexture).m_height;
    this->m_height = iVar3;
  }
  return iVar3;
}

Assistant:

void TextureWrapCase::init (void)
{
	if (!m_filenames.empty())
	{
		DE_ASSERT(m_width == 0 && m_height == 0 && m_format == GL_NONE && m_dataType == GL_NONE);

		m_texture	= glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames);
		m_width		= m_texture->getRefTexture().getWidth();
		m_height	= m_texture->getRefTexture().getHeight();
	}
	else
	{
		m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

		// Fill level 0.
		m_texture->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));

		m_texture->upload();
	}
}